

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O1

FunctionValue *
SelectBestFunction(FunctionValue *__return_storage_ptr__,ExpressionContext *ctx,SynBase *source,
                  ArrayView<FunctionValue> functions,IntrusiveList<TypeHandle> generics,
                  ArrayView<ArgumentData> arguments,SmallArray<unsigned_int,_32U> *ratings)

{
  TypeHandle **ppTVar1;
  ModuleData *__s;
  ModuleData *pMVar2;
  ExprBase *pEVar3;
  uint *puVar4;
  TypeStruct *pTVar5;
  SynIdentifier *pSVar6;
  FunctionData *pFVar7;
  ExpressionContext *pEVar8;
  undefined8 uVar9;
  undefined4 uVar10;
  FunctionValue proto;
  FunctionValue *pFVar11;
  bool bVar12;
  uint depth;
  uint uVar13;
  int iVar14;
  TypeBase *pTVar15;
  TypeUnsizedArray *pTVar16;
  MatchData *pMVar17;
  undefined4 extraout_var;
  TypeFunction *instance;
  TypeHandle *pTVar18;
  int iVar19;
  uint uVar20;
  FunctionValue *pFVar21;
  TypeUnsizedArray *pTVar22;
  ulong uVar23;
  SynBase *pSVar24;
  ExpressionContext *pEVar25;
  ExpressionContext *pEVar26;
  FunctionData *pFVar27;
  ExpressionContext *pEVar28;
  uint newSize;
  SynBase *pSVar29;
  ScopeData *parentType;
  ExprBase **ppEVar30;
  char cVar31;
  ArrayView<ArgumentData> functionArguments;
  ArrayView<CallArgumentData> arguments_00;
  ArrayView<CallArgumentData> arguments_01;
  IntrusiveList<TypeHandle> generics_00;
  ArrayView<ArgumentData> arguments_02;
  ArrayView<CallArgumentData> arguments_03;
  uint extraRating;
  IntrusiveList<MatchData> aliases;
  SmallArray<TypeFunction_*,_16U> instanceTypes;
  SmallArray<CallArgumentData,_16U> result;
  TypeUnsizedArray *local_280;
  uint local_23c;
  SynBase *local_238;
  SynBase *local_230;
  FunctionValue *local_228;
  FunctionData *local_220;
  ExpressionContext *local_218;
  SynBase *local_210;
  ExpressionContext *local_208;
  FunctionData *local_200;
  undefined1 local_1f8 [32];
  undefined8 local_1d8;
  TypeFunction *local_1d0 [16];
  ModuleData *local_150;
  undefined1 local_148 [272];
  ModuleData *local_38;
  MatchData *node;
  
  pFVar21 = functions.data;
  newSize = functions.count;
  pEVar25 = (ExpressionContext *)(functions._8_8_ & 0xffffffff);
  local_230 = source;
  local_228 = __return_storage_ptr__;
  if (ratings->max <= newSize) {
    SmallArray<unsigned_int,_32U>::grow(ratings,newSize);
  }
  ratings->count = newSize;
  pMVar2 = (ModuleData *)ctx->allocator;
  local_1f8._24_8_ = local_1d0;
  local_1d8 = (ModuleData **)0x1000000000;
  __s = (ModuleData *)(local_148 + 0x10);
  local_150 = pMVar2;
  memset(__s,0,0x100);
  local_148._8_4_ = 0;
  local_148._12_4_ = 0x10;
  local_148._0_8_ = __s;
  local_38 = pMVar2;
  if (newSize == 0) {
    local_280 = (TypeUnsizedArray *)0x0;
  }
  else {
    local_238 = (SynBase *)CONCAT71(local_238._1_7_,generics.head == (TypeHandle *)0x0);
    pEVar26 = (ExpressionContext *)0x0;
    local_280 = (TypeUnsizedArray *)0x0;
    do {
      pFVar27 = pFVar21[(long)pEVar26].function;
      pEVar3 = pFVar21[(long)pEVar26].context;
      if ((uint)local_1d8 == local_1d8._4_4_) {
        SmallArray<TypeFunction_*,_16U>::grow
                  ((SmallArray<TypeFunction_*,_16U> *)(local_1f8 + 0x18),(uint)local_1d8);
      }
      if ((TypeFunction **)local_1f8._24_8_ == (TypeFunction **)0x0) {
        __assert_fail("data",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                      ,0x162,
                      "void SmallArray<TypeFunction *, 16>::push_back(const T &) [T = TypeFunction *, N = 16]"
                     );
      }
      uVar23 = (ulong)local_1d8 & 0xffffffff;
      local_1d8 = (ModuleData **)CONCAT44(local_1d8._4_4_,(uint)local_1d8 + 1);
      *(TypeFunction **)(local_1f8._24_8_ + uVar23 * 8) = pFVar27->type;
      pTVar15 = pEVar3->type;
      if ((pTVar15 == (TypeBase *)0x0) || (pTVar15->typeID != 0x12)) {
        pTVar15 = (TypeBase *)0x0;
      }
      pTVar22 = local_280;
      if (pTVar15 != (TypeBase *)0x0) {
        pTVar16 = (TypeUnsizedArray *)pTVar15[1]._vptr_TypeBase;
        if ((pTVar16 == (TypeUnsizedArray *)0x0) ||
           ((pTVar16->super_TypeStruct).super_TypeBase.typeID != 0x18)) {
          pTVar16 = (TypeUnsizedArray *)0x0;
        }
        if ((((pTVar16 != (TypeUnsizedArray *)0x0) &&
             (*(char *)&pTVar16[1].super_TypeStruct.constants.tail == '\x01')) &&
            (pTVar22 = pTVar16, local_280 != (TypeUnsizedArray *)0x0)) &&
           (pTVar22 = local_280, local_280 != pTVar16)) {
          __assert_fail("preferredParent == typeClass",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                        ,0x19f1,
                        "FunctionValue SelectBestFunction(ExpressionContext &, SynBase *, ArrayView<FunctionValue>, IntrusiveList<TypeHandle>, ArrayView<ArgumentData>, SmallArray<unsigned int, 32> &)"
                       );
        }
      }
      local_280 = pTVar22;
      if (generics.head == (TypeHandle *)0x0) {
LAB_001636b2:
        local_23c = 0;
        uVar9 = (pFVar27->arguments).data;
        uVar10 = (pFVar27->arguments).count;
        functionArguments.count = uVar10;
        functionArguments.data = (ArgumentData *)uVar9;
        functionArguments._12_4_ = 0;
        arguments_02._12_4_ = 0;
        arguments_02.data = (ArgumentData *)SUB128(arguments._0_12_,0);
        arguments_02.count = SUB124(arguments._0_12_,8);
        bVar12 = PrepareArgumentsForFunctionCall
                           (ctx,local_230,functionArguments,arguments_02,
                            (SmallArray<CallArgumentData,_16U> *)local_148,&local_23c,false);
        if (!bVar12) goto LAB_0016387b;
        arguments_00.count = local_148._8_4_;
        arguments_00.data = (CallArgumentData *)local_148._0_8_;
        arguments_00._12_4_ = 0;
        pEVar28 = ctx;
        uVar13 = GetFunctionRating(ctx,pFVar27,pFVar27->type,arguments_00);
        puVar4 = ratings->data;
        puVar4[(long)pEVar26] = uVar13;
        if (uVar13 != 0xffffffff) {
          puVar4[(long)pEVar26] = local_23c + uVar13;
          bVar12 = ExpressionContext::IsGenericFunction(pEVar28,pFVar27);
          if (bVar12) {
            pTVar5 = (TypeStruct *)pEVar3->type;
            parentType = (ScopeData *)pFVar27->scope->ownerType;
            if (pTVar5 == ctx->typeAutoRef) {
              if (parentType == (ScopeData *)0x0) {
                __assert_fail("function->scope->ownerType",
                              "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                              ,0x1a2b,
                              "FunctionValue SelectBestFunction(ExpressionContext &, SynBase *, ArrayView<FunctionValue>, IntrusiveList<TypeHandle>, ArrayView<ArgumentData>, SmallArray<unsigned int, 32> &)"
                             );
              }
            }
            else if (parentType == (ScopeData *)0x0) {
              parentType = (ScopeData *)0x0;
            }
            else {
              parentType = pTVar5->typeScope;
            }
            local_1f8._0_8_ = (MatchData *)0x0;
            local_1f8._8_8_ = (MatchData *)0x0;
            pMVar17 = (pFVar27->generics).head;
            pTVar18 = generics.head;
            if (pMVar17 != (MatchData *)0x0 && generics.head != (TypeHandle *)0x0) {
              do {
                iVar14 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x20);
                node = (MatchData *)CONCAT44(extraout_var,iVar14);
                pSVar6 = pMVar17->name;
                pTVar15 = pTVar18->type;
                node->name = pSVar6;
                node->type = pTVar15;
                node->next = (MatchData *)0x0;
                node->listed = false;
                if (pSVar6 == (SynIdentifier *)0x0) {
                  __assert_fail("name",
                                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/TypeTree.h"
                                ,0xf6,"MatchData::MatchData(SynIdentifier *, TypeBase *)");
                }
                IntrusiveList<MatchData>::push_back((IntrusiveList<MatchData> *)local_1f8,node);
                pMVar17 = pMVar17->next;
              } while ((pMVar17 != (MatchData *)0x0) &&
                      (ppTVar1 = &pTVar18->next, pTVar18 = *ppTVar1, *ppTVar1 != (TypeHandle *)0x0))
              ;
            }
            arguments_03.count = local_148._8_4_;
            arguments_03.data = (CallArgumentData *)local_148._0_8_;
            arguments_03._12_4_ = 0;
            instance = GetGenericFunctionInstanceType
                                 (ctx,local_230,(TypeBase *)parentType,pFVar27,arguments_03,
                                  (IntrusiveList<MatchData> *)local_1f8);
            if ((uint)local_1d8 == 0) {
              __assert_fail("count > 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                            ,0x172,
                            "T &SmallArray<TypeFunction *, 16>::back() [T = TypeFunction *, N = 16]"
                           );
            }
            *(TypeFunction **)(local_1f8._24_8_ + (ulong)((uint)local_1d8 - 1) * 8) = instance;
            if (instance == (TypeFunction *)0x0) goto LAB_0016387b;
            arguments_01.count = local_148._8_4_;
            arguments_01.data = (CallArgumentData *)local_148._0_8_;
            arguments_01._12_4_ = 0;
            uVar13 = GetFunctionRating(ctx,pFVar27,instance,arguments_01);
            ratings->data[(long)pEVar26] = uVar13;
          }
        }
      }
      else {
        pMVar17 = (pFVar27->generics).head;
        pTVar18 = generics.head;
        cVar31 = (char)local_238;
        if (pMVar17 != (MatchData *)0x0 && generics.head != (TypeHandle *)0x0) {
          do {
            if ((pMVar17->type->isGeneric == false) && (pMVar17->type != pTVar18->type))
            goto LAB_0016387b;
            pMVar17 = pMVar17->next;
            pTVar18 = pTVar18->next;
            cVar31 = pTVar18 == (TypeHandle *)0x0;
          } while ((pMVar17 != (MatchData *)0x0) && (pTVar18 != (TypeHandle *)0x0));
        }
        if (cVar31 != '\0') goto LAB_001636b2;
LAB_0016387b:
        ratings->data[(long)pEVar26] = 0xffffffff;
      }
      pEVar26 = (ExpressionContext *)((long)&pEVar26->optimizationLevel + 1);
    } while (pEVar26 != pEVar25);
  }
  if (newSize != 0 && local_280 != (TypeUnsizedArray *)0x0) {
    pEVar26 = (ExpressionContext *)0x0;
    do {
      pFVar27 = pFVar21[(long)pEVar26].function;
      pEVar28 = (ExpressionContext *)0x0;
      do {
        if (pEVar26 != pEVar28) {
          uVar13 = ratings->data[(long)pEVar28];
          if ((uVar13 != 0xffffffff) && (ratings->data[(long)pEVar26] == uVar13)) {
            if ((ExpressionContext *)((ulong)local_1d8 & 0xffffffff) <= pEVar26) {
LAB_00163d2a:
              __assert_fail("index < count",
                            "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                            ,0x199,
                            "T &SmallArray<TypeFunction *, 16>::operator[](unsigned int) [T = TypeFunction *, N = 16]"
                           );
            }
            iVar14 = 0;
            for (pTVar18 = ((*(TypeFunction **)(local_1f8._24_8_ + pEVar26 * 8))->arguments).head;
                pTVar18 != (TypeHandle *)0x0; pTVar18 = pTVar18->next) {
              iVar14 = iVar14 + 1;
            }
            if ((ExpressionContext *)((ulong)local_1d8 & 0xffffffff) <= pEVar28) goto LAB_00163d2a;
            iVar19 = 0;
            for (pTVar18 = ((*(TypeFunction **)(local_1f8._24_8_ + pEVar28 * 8))->arguments).head;
                pTVar18 != (TypeHandle *)0x0; pTVar18 = pTVar18->next) {
              iVar19 = iVar19 + 1;
            }
            if (iVar14 == iVar19) {
              if ((ExpressionContext *)((ulong)local_1d8 & 0xffffffff) <= pEVar26)
              goto LAB_00163d2a;
              pFVar7 = pFVar21[(long)pEVar28].function;
              bVar12 = true;
              uVar13 = 0;
              while( true ) {
                pTVar18 = ((*(TypeFunction **)(local_1f8._24_8_ + pEVar26 * 8))->arguments).head;
                uVar20 = 0;
                if (pTVar18 != (TypeHandle *)0x0) {
                  uVar20 = 0;
                  do {
                    uVar20 = uVar20 + 1;
                    pTVar18 = pTVar18->next;
                  } while (pTVar18 != (TypeHandle *)0x0);
                }
                if (uVar20 <= uVar13) break;
                pTVar18 = IntrusiveList<TypeHandle>::operator[]
                                    (&(*(TypeFunction **)(local_1f8._24_8_ + pEVar26 * 8))->
                                      arguments,uVar13);
                if ((ExpressionContext *)((ulong)local_1d8 & 0xffffffff) <= pEVar28)
                goto LAB_00163d2a;
                pTVar15 = pTVar18->type;
                pTVar18 = IntrusiveList<TypeHandle>::operator[]
                                    (&(*(TypeFunction **)(local_1f8._24_8_ + pEVar28 * 8))->
                                      arguments,uVar13);
                if (pTVar15 != pTVar18->type) {
                  bVar12 = false;
                }
                uVar13 = uVar13 + 1;
                if ((ExpressionContext *)((ulong)local_1d8 & 0xffffffff) <= pEVar26)
                goto LAB_00163d2a;
              }
              if (bVar12) {
                pTVar15 = pFVar27->scope->ownerType;
                if ((pTVar15 == (TypeBase *)0x0) || (pTVar15->typeID != 0x18)) {
                  pTVar15 = (TypeBase *)0x0;
                }
                uVar13 = 0;
                pTVar22 = local_280;
                do {
                  if (pTVar22 == (TypeUnsizedArray *)pTVar15) goto LAB_00163a4f;
                  uVar13 = uVar13 + 1;
                  pTVar22 = *(TypeUnsizedArray **)
                             &((TypeStruct *)&pTVar22[1].subType)->super_TypeBase;
                } while (pTVar22 != (TypeUnsizedArray *)0x0);
                uVar13 = 0xffffffff;
LAB_00163a4f:
                pTVar22 = (TypeUnsizedArray *)pFVar7->scope->ownerType;
                if ((pTVar22 == (TypeUnsizedArray *)0x0) ||
                   ((pTVar22->super_TypeStruct).super_TypeBase.typeID != 0x18)) {
                  pTVar22 = (TypeUnsizedArray *)0x0;
                }
                uVar20 = 0;
                pTVar16 = local_280;
                do {
                  if (pTVar16 == pTVar22) goto LAB_00163a83;
                  uVar20 = uVar20 + 1;
                  pTVar16 = (TypeUnsizedArray *)pTVar16[1].subType;
                } while (pTVar16 != (TypeUnsizedArray *)0x0);
                uVar20 = 0xffffffff;
LAB_00163a83:
                if (uVar13 < uVar20) {
                  ratings->data[(long)pEVar28] = 0xffffffff;
                }
              }
            }
          }
        }
        pEVar28 = (ExpressionContext *)((long)&pEVar28->optimizationLevel + 1);
      } while (pEVar28 != pEVar25);
      pEVar26 = (ExpressionContext *)((long)&pEVar26->optimizationLevel + 1);
    } while (pEVar26 != pEVar25);
  }
  local_228->source = (SynBase *)0x0;
  local_228->function = (FunctionData *)0x0;
  local_228->context = (ExprBase *)0x0;
  if (newSize == 0) {
    local_280._0_4_ = 0xffffffff;
    pSVar29 = (SynBase *)0x0;
    pSVar24 = (SynBase *)0x0;
    pFVar27 = (FunctionData *)0x0;
    pEVar26 = (ExpressionContext *)0x0;
    pTVar18 = (TypeHandle *)0xffffffff;
  }
  else {
    puVar4 = ratings->data;
    local_220 = local_228->function;
    local_218 = (ExpressionContext *)local_228->context;
    ppEVar30 = &pFVar21->context;
    uVar13 = 0xffffffff;
    pEVar28 = (ExpressionContext *)0x0;
    local_280._0_4_ = 0xffffffff;
    local_208 = (ExpressionContext *)0x0;
    local_200 = (FunctionData *)0x0;
    local_238 = (SynBase *)0x0;
    local_210 = (SynBase *)0x0;
    pEVar26 = pEVar25;
    do {
      pSVar24 = ((FunctionValue *)(ppEVar30 + -2))->source;
      pFVar27 = (FunctionData *)ppEVar30[-1];
      pEVar8 = (ExpressionContext *)*ppEVar30;
      bVar12 = ExpressionContext::IsGenericFunction(pEVar26,pFVar27);
      uVar20 = puVar4[(long)pEVar28];
      if (bVar12) {
        if (uVar20 < uVar13) {
          local_238 = pSVar24;
          local_208 = pEVar8;
          local_200 = pFVar27;
          uVar13 = uVar20;
        }
      }
      else if (uVar20 < (uint)local_280) {
        local_220 = pFVar27;
        local_218 = pEVar8;
        local_210 = pSVar24;
        local_280._0_4_ = uVar20;
      }
      pEVar28 = (ExpressionContext *)((long)&pEVar28->optimizationLevel + 1);
      ppEVar30 = ppEVar30 + 3;
    } while (pEVar25 != pEVar28);
    local_228->function = local_220;
    local_228->context = (ExprBase *)local_218;
    pTVar18 = (TypeHandle *)(ulong)uVar13;
    pSVar24 = local_238;
    pFVar27 = local_200;
    pEVar26 = local_208;
    pSVar29 = local_210;
  }
  pFVar11 = local_228;
  local_228->source = pSVar29;
  if ((uint)pTVar18 < (uint)local_280) {
    local_228->source = pSVar24;
    local_228->function = pFVar27;
    local_228->context = (ExprBase *)pEVar26;
  }
  else if (newSize != 0) {
    pEVar28 = (ExpressionContext *)0x0;
    do {
      pFVar27 = pFVar21->function;
      bVar12 = ExpressionContext::IsGenericFunction(pEVar26,pFVar27);
      if (bVar12) {
        if (((((uint)local_280 != 0xffffffff) && (ratings->data[(long)pEVar28] == (uint)local_280))
            && ((TypeStruct *)pFVar21->context->type == ctx->typeAutoRef)) &&
           (pFVar27->scope->ownerType->isGeneric == false)) {
          pEVar26 = (ExpressionContext *)local_1f8;
          proto.context._4_4_ = (int)((ulong)pFVar21->context >> 0x20);
          proto._0_20_ = *(undefined1 (*) [20])pFVar21;
          generics_00.tail = pTVar18;
          generics_00.head = generics.head;
          CreateGenericFunctionInstance
                    ((FunctionValue *)pEVar26,ctx,local_230,proto,generics_00,arguments,true);
        }
        ratings->data[(long)pEVar28] = 0xffffffff;
      }
      pEVar28 = (ExpressionContext *)((long)&pEVar28->optimizationLevel + 1);
      pFVar21 = pFVar21 + 1;
    } while (pEVar25 != pEVar28);
  }
  SmallArray<CallArgumentData,_16U>::~SmallArray((SmallArray<CallArgumentData,_16U> *)local_148);
  SmallArray<TypeFunction_*,_16U>::~SmallArray
            ((SmallArray<TypeFunction_*,_16U> *)(local_1f8 + 0x18));
  return pFVar11;
}

Assistant:

FunctionValue SelectBestFunction(ExpressionContext &ctx, SynBase *source, ArrayView<FunctionValue> functions, IntrusiveList<TypeHandle> generics, ArrayView<ArgumentData> arguments, SmallArray<unsigned, 32> &ratings)
{
	ratings.resize(functions.count);

	SmallArray<TypeFunction*, 16> instanceTypes(ctx.allocator);

	SmallArray<CallArgumentData, 16> result(ctx.allocator);

	TypeClass *preferredParent = NULL;

	for(unsigned i = 0; i < functions.count; i++)
	{
		FunctionValue value = functions.data[i];

		FunctionData *function = value.function;

		instanceTypes.push_back(function->type);

		if(TypeRef *typeRef = getType<TypeRef>(value.context->type))
		{
			if(TypeClass *typeClass = getType<TypeClass>(typeRef->subType))
			{
				if(typeClass->extendable)
				{
					if(!preferredParent)
						preferredParent = typeClass;
					else
						assert(preferredParent == typeClass);
				}
			}
		}

		if(!generics.empty())
		{
			MatchData *ca = function->generics.head;
			TypeHandle *cb = generics.head;

			bool sameGenerics = true;

			for(; ca && cb; ca = ca->next, cb = cb->next)
			{
				if(!ca->type->isGeneric && ca->type != cb->type)
				{
					sameGenerics = false;
					break;
				}
			}

			// Fail if provided explicit type list elements can't match
			if(!sameGenerics)
			{
				ratings.data[i] = ~0u;
				continue;
			}

			// Fail if provided explicit type list is larger than expected explicit type list
			if(cb)
			{
				ratings.data[i] = ~0u;
				continue;
			}
		}

		unsigned extraRating = 0;

		// Handle named argument order, default argument values and variadic functions
		if(!PrepareArgumentsForFunctionCall(ctx, source, function->arguments, arguments, result, &extraRating, false))
		{
			ratings.data[i] = ~0u;
			continue;
		}

		ratings.data[i] = GetFunctionRating(ctx, function, function->type, result);

		if(ratings.data[i] == ~0u)
			continue;

		ratings.data[i] += extraRating;

		if(ctx.IsGenericFunction(function))
		{
			TypeBase *parentType = NULL;

			if(value.context->type == ctx.typeAutoRef)
			{
				assert(function->scope->ownerType);
				parentType = function->scope->ownerType;
			}
			else if(function->scope->ownerType)
			{
				parentType = getType<TypeRef>(value.context->type)->subType;
			}

			IntrusiveList<MatchData> aliases;

			{
				MatchData *currMatch = function->generics.head;
				TypeHandle *currGeneric = generics.head;

				for(; currMatch && currGeneric; currMatch = currMatch->next, currGeneric = currGeneric->next)
					aliases.push_back(new (ctx.get<MatchData>()) MatchData(currMatch->name, currGeneric->type));
			}

			TypeFunction *instance = GetGenericFunctionInstanceType(ctx, source, parentType, function, result, aliases);

			instanceTypes.back() = instance;

			if(!instance)
			{
				ratings.data[i] = ~0u;
				continue;
			}
			
			ratings.data[i] = GetFunctionRating(ctx, function, instance, result);

			if(ratings.data[i] == ~0u)
				continue;
		}
	}

	// For member functions, if there are multiple functions with the same rating and arguments, hide those which parent is derived further from preferred parent
	if(preferredParent)
	{
		for(unsigned i = 0; i < functions.count; i++)
		{
			FunctionData *a = functions.data[i].function;

			for(unsigned k = 0; k < functions.size(); k++)
			{
				if(i == k)
					continue;

				if(ratings.data[k] == ~0u)
					continue;

				FunctionData *b = functions.data[k].function;

				if(ratings.data[i] == ratings.data[k] && instanceTypes[i]->arguments.size() == instanceTypes[k]->arguments.size())
				{
					bool sameArguments = true;

					for(unsigned arg = 0; arg < instanceTypes[i]->arguments.size(); arg++)
					{
						if(instanceTypes[i]->arguments[arg]->type != instanceTypes[k]->arguments[arg]->type)
							sameArguments = false;
					}

					if(sameArguments)
					{
						unsigned aDepth = GetDerivedFromDepth(preferredParent, getType<TypeClass>(a->scope->ownerType));
						unsigned bDepth = GetDerivedFromDepth(preferredParent, getType<TypeClass>(b->scope->ownerType));

						if (aDepth < bDepth)
							ratings.data[k] = ~0u;
					}
				}
			}
		}
	}

	// Select best generic and non-generic function
	unsigned bestRating = ~0u;
	FunctionValue bestFunction;

	unsigned bestGenericRating = ~0u;
	FunctionValue bestGenericFunction;

	for(unsigned i = 0; i < functions.count; i++)
	{
		FunctionValue value = functions.data[i];

		FunctionData *function = value.function;

		if(ctx.IsGenericFunction(function))
		{
			if(ratings.data[i] < bestGenericRating)
			{
				bestGenericRating = ratings.data[i];
				bestGenericFunction = value;
			}
		}
		else
		{
			if(ratings.data[i] < bestRating)
			{
				bestRating = ratings.data[i];
				bestFunction = value;
			}
		}
	}

	// Use generic function only if it is better that selected
	if(bestGenericRating < bestRating)
	{
		bestRating = bestGenericRating;
		bestFunction = bestGenericFunction;
	}
	else
	{
		// Hide all generic functions from selection
		for(unsigned i = 0; i < functions.count; i++)
		{
			FunctionData *function = functions.data[i].function;

			if(ctx.IsGenericFunction(function))
			{
				if(bestRating != ~0u && ratings.data[i] == bestRating && functions.data[i].context->type == ctx.typeAutoRef && !function->scope->ownerType->isGeneric)
					CreateGenericFunctionInstance(ctx, source, functions.data[i], generics, arguments, true);

				ratings.data[i] = ~0u;
			}
		}
	}

	return bestFunction;
}